

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstspolicy.cpp
# Opt level: O3

void __thiscall QHstsPolicy::setIncludesSubDomains(QHstsPolicy *this,bool include)

{
  QHstsPolicyPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QHstsPolicyPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  pQVar1->includeSubDomains = include;
  return;
}

Assistant:

void QHstsPolicy::setIncludesSubDomains(bool include)
{
    d->includeSubDomains = include;
}